

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

char * skip_idf(char *start,char *out_idf)

{
  char *__src;
  ushort **ppuVar1;
  char cVar2;
  char *pcVar3;
  
  __src = skip_white(start);
  if (__src == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    cVar2 = *__src;
    pcVar3 = __src;
    if (cVar2 != '\0') {
      ppuVar1 = __ctype_b_loc();
      do {
        if ((cVar2 != '_') && (((*ppuVar1)[cVar2] & 0x400) == 0)) break;
        cVar2 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while (cVar2 != '\0');
    }
    *pcVar3 = '\0';
    strncpy(out_idf,__src,0xff);
    *pcVar3 = cVar2;
  }
  return pcVar3;
}

Assistant:

static char *skip_idf(char *start, char out_idf[256])
{
    char *s;
    char c;

    s = skip_white(start);
    if (s == NULL) {
        return NULL;
    }
    start = s;

    while (*s) {
        if (isalpha(*s) || *s == '_') {
            ++s;
            continue;
        }
        break;
    }
    c = *s;
    *s = 0;
    strncpy(out_idf, start, 255);
    *s = c;
    return s;
}